

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

Image * read_png_file(char *filename)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out;
  uint *h;
  byte bVar1;
  pointer puVar2;
  uint uVar3;
  uint uVar4;
  Image *w;
  ostream *poVar5;
  char *pcVar6;
  size_t sVar7;
  uchar *puVar8;
  ulong uVar9;
  uchar uVar10;
  int iVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> png;
  State state;
  allocator local_279;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_278;
  string local_260;
  LodePNGState local_240;
  
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  w = (Image *)operator_new(0x50);
  (w->pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (w->pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (w->pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lodepng::State::State((State *)&local_240);
  std::__cxx11::string::string((string *)&local_260,filename,&local_279);
  uVar3 = lodepng::load_file(&local_278,&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p);
  }
  if (uVar3 == 0) {
    uVar3 = lodepng_inspect((uint *)w,&w->height,&local_240,
                            local_278.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_278.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_278.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
  }
  out = &w->pixels;
  if (uVar3 == 0) {
    if (local_240.info_png.color.colortype == LCT_PALETTE) {
      if (4 < local_240.info_png.color.bitdepth) {
        puts("[read_png_file] PNG bit depth > 4. Only the first 16 colours will be used.");
      }
      local_240.info_raw.colortype = LCT_PALETTE;
      local_240.info_raw.bitdepth = 8;
      h = &w->height;
      uVar3 = lodepng::decode(out,(uint *)w,h,(State *)&local_240,&local_278);
      if (uVar3 == 0) {
        if (*h != 0) {
          uVar3 = 0;
          do {
            uVar4 = w->width;
            if (uVar4 != 0) {
              uVar9 = 0;
              do {
                iVar11 = (int)uVar9;
                bVar1 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start[uVar4 * uVar3 + iVar11];
                if (0xf < bVar1) {
                  printf("Warning: color palette index[%d] used at pixel(%d,%d).\n",(ulong)bVar1,
                         uVar9,(ulong)uVar3);
                  (w->pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start[w->width * uVar3 + iVar11] = '\0';
                }
                uVar9 = (ulong)(iVar11 + 1U);
                uVar4 = w->width;
              } while (iVar11 + 1U < uVar4);
            }
            uVar3 = uVar3 + 1;
          } while (uVar3 < *h);
        }
        puVar8 = &w->palette[0].blue;
        uVar9 = 0;
        do {
          if (uVar9 < local_240.info_png.color.palettesize) {
            ((Color *)(puVar8 + -2))->red = local_240.info_png.color.palette[uVar9 * 4];
            puVar8[-1] = local_240.info_png.color.palette[uVar9 * 4 + 1];
            uVar10 = local_240.info_png.color.palette[uVar9 * 4 + 2];
          }
          else {
            ((Color *)(puVar8 + -2))->red = '\0';
            ((Color *)(puVar8 + -2))->green = '\0';
            uVar10 = '\0';
          }
          *puVar8 = uVar10;
          uVar9 = uVar9 + 1;
          puVar8 = puVar8 + 3;
        } while (uVar9 != 0x10);
        goto LAB_00113f77;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[read_png_file] decoder error ",0x1e);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
      pcVar6 = lodepng_error_text(uVar3);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    else {
      puts("[read_png_file] Only indexed PNG files allowed");
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[read_png_file] error reading file ",0x23);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
    pcVar6 = lodepng_error_text(uVar3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  puVar2 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  operator_delete(w);
  w = (Image *)0x0;
LAB_00113f77:
  lodepng::State::~State((State *)&local_240);
  if (local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return w;
}

Assistant:

Image *read_png_file(const char *filename) {
    std::vector<unsigned char> png;
    Image *image = new Image;
    lodepng::State state;

    unsigned error = lodepng::load_file(png, filename);
    if (!error) error = lodepng_inspect(&image->width, &image->height, &state, &png[0], png.size());
    if (error) {
        std::cout << "[read_png_file] error reading file " << error << ": "<< lodepng_error_text(error) << std::endl;
        delete image;
        return nullptr;
    }

    if (state.info_png.color.colortype != LCT_PALETTE) {
        printf("[read_png_file] Only indexed PNG files allowed\n");
        delete image;
        return nullptr;
    }

    if (state.info_png.color.bitdepth > 4) {
        printf("[read_png_file] PNG bit depth > 4. Only the first 16 colours will be used.\n");
    }

    state.info_raw.colortype = LCT_PALETTE;
    state.info_raw.bitdepth = 8;


    if(!error) error = lodepng::decode(image->pixels, image->width, image->height, state, png);
    if (error) {
        std::cout << "[read_png_file] decoder error " << error << ": "<< lodepng_error_text(error) << std::endl;
        delete image;
        return nullptr;
    }

    // Remove all colors after the first 16 palette entries.
    for (int y = 0; y < image->height; y++) {
        for (int x = 0; x < image->width; x++) {
            if (image->pixels[x + y * image->width] >= MAX_COLOURS) {
                printf("Warning: color palette index[%d] used at pixel(%d,%d).\n", image->pixels[x + y * image->width], x, y);
                image->pixels[x + y * image->width] = 0;
            }
        }
    }

    for(int i = 0; i < MAX_COLOURS; i++) {
        if (i < state.info_png.color.palettesize) {
            image->palette[i].red = state.info_png.color.palette[i * 4];
            image->palette[i].green = state.info_png.color.palette[i * 4 + 1];
            image->palette[i].blue = state.info_png.color.palette[i * 4 + 2];
        } else {
            image->palette[i].red   = 0;
            image->palette[i].green = 0;
            image->palette[i].blue  = 0;
        }
    }
    return image;
}